

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

RenderSampleAnalyzeResult
deqp::gles3::Performance::anon_unknown_1::
analyzeSampleResults<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
          (TestLog *log,
          vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
          *samples)

{
  int iVar1;
  RenderSampleAnalyzeResult RVar2;
  const_reference pvVar3;
  TestLog *pTVar4;
  offset_in_SampleType_to_deUint64 in_RCX;
  allocator<char> local_c59;
  string local_c58;
  allocator<char> local_c31;
  string local_c30;
  allocator<char> local_c09;
  string local_c08;
  LogNumber<float> local_be8;
  allocator<char> local_b79;
  string local_b78;
  allocator<char> local_b51;
  string local_b50;
  allocator<char> local_b29;
  string local_b28;
  LogNumber<float> local_b08;
  allocator<char> local_a99;
  string local_a98;
  allocator<char> local_a71;
  string local_a70;
  allocator<char> local_a49;
  string local_a48;
  LogNumber<float> local_a28;
  allocator<char> local_9b9;
  string local_9b8;
  allocator<char> local_991;
  string local_990;
  allocator<char> local_969;
  string local_968;
  LogNumber<float> local_948;
  allocator<char> local_8d9;
  string local_8d8;
  allocator<char> local_8b1;
  string local_8b0;
  allocator<char> local_889;
  string local_888;
  LogNumber<float> local_868;
  allocator<char> local_7f9;
  string local_7f8;
  allocator<char> local_7d1;
  string local_7d0;
  allocator<char> local_7a9;
  string local_7a8;
  LogNumber<float> local_788;
  allocator<char> local_719;
  string local_718;
  allocator<char> local_6f1;
  string local_6f0;
  allocator<char> local_6c9;
  string local_6c8;
  LogNumber<float> local_6a8;
  allocator<char> local_639;
  string local_638;
  allocator<char> local_611;
  string local_610;
  allocator<char> local_5e9;
  string local_5e8;
  LogNumber<float> local_5c8;
  allocator<char> local_559;
  string local_558;
  allocator<char> local_531;
  string local_530;
  allocator<char> local_509;
  string local_508;
  LogNumber<float> local_4e8;
  allocator<char> local_479;
  string local_478;
  allocator<char> local_451;
  string local_450;
  allocator<char> local_429;
  string local_428;
  LogNumber<float> local_408;
  allocator<char> local_399;
  string local_398;
  allocator<char> local_371;
  string local_370;
  allocator<char> local_349;
  string local_348;
  LogNumber<float> local_328;
  allocator<char> local_2b9;
  string local_2b8;
  allocator<char> local_291;
  string local_290;
  allocator<char> local_269;
  string local_268;
  LogNumber<float> local_248;
  float local_1e0;
  float local_1dc;
  float sampleTemporalStability;
  float sampleLinearity;
  float approximatedRenderTimeNoConstant;
  float approximatedRenderTime;
  int medianDataSize;
  allocator<char> local_1a1;
  string local_1a0;
  ScopedLogSection local_180;
  ScopedLogSection section_2;
  string local_170;
  allocator<char> local_149;
  string local_148;
  ScopedLogSection local_128;
  ScopedLogSection section_1;
  string local_118;
  allocator<char> local_e1;
  string local_e0;
  ScopedLogSection local_c0;
  ScopedLogSection section;
  float approximatedProcessingRateNoConstant;
  float approximatedProcessingRate;
  StatsType resultStats;
  LineParametersWithConfidence theilSenFitting;
  vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
  *samples_local;
  TestLog *log_local;
  RenderSampleAnalyzeResult result;
  
  Performance::(anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>>
            ((LineParametersWithConfidence *)&resultStats.max9DecileRelDiffTime,
             (_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
              *)0x20,in_RCX);
  calculateSampleStatistics
            ((RenderReadStatistics *)&approximatedProcessingRateNoConstant,
             (LineParametersWithConfidence *)&resultStats.max9DecileRelDiffTime,samples);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"Samples",&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"Samples",(allocator<char> *)((long)&section_1.m_log + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_c0,log,&local_e0,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)((long)&section_1.m_log + 7));
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  logSampleList(log,(LineParametersWithConfidence *)&resultStats.max9DecileRelDiffTime,samples);
  tcu::ScopedLogSection::~ScopedLogSection(&local_c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"Contribution",&local_149)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"Contributions",(allocator<char> *)((long)&section_2.m_log + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_128,log,&local_148,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator((allocator<char> *)((long)&section_2.m_log + 7));
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  logFirstRenderContribution<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
            (log,samples,(StatsType *)&approximatedProcessingRateNoConstant);
  logUploadContribution<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
            (log,samples,(StatsType *)&approximatedProcessingRateNoConstant);
  logRenderContribution<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
            (log,samples,(StatsType *)&approximatedProcessingRateNoConstant);
  logSecondRenderContribution<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
            (log,samples,(StatsType *)&approximatedProcessingRateNoConstant);
  logReadContribution<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
            (log,samples,(StatsType *)&approximatedProcessingRateNoConstant);
  logTotalContribution<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
            (log,samples,(StatsType *)&approximatedProcessingRateNoConstant);
  tcu::ScopedLogSection::~ScopedLogSection(&local_128);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"Results",&local_1a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&medianDataSize,"Results",
             (allocator<char> *)((long)&approximatedRenderTime + 3));
  tcu::ScopedLogSection::ScopedLogSection(&local_180,log,&local_1a0,(string *)&medianDataSize);
  std::__cxx11::string::~string((string *)&medianDataSize);
  std::allocator<char>::~allocator((allocator<char> *)((long)&approximatedRenderTime + 3));
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  pvVar3 = std::
           vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
           ::front(samples);
  iVar1 = pvVar3->renderDataSize;
  pvVar3 = std::
           vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
           ::back(samples);
  approximatedRenderTimeNoConstant = (float)((iVar1 + pvVar3->renderDataSize) / 2);
  sampleLinearity =
       ((theilSenFitting.offsetConfidenceUpper * (float)(int)approximatedRenderTimeNoConstant +
        resultStats.max9DecileRelDiffTime) / 1000.0) / 1000.0;
  sampleTemporalStability =
       ((theilSenFitting.offsetConfidenceUpper * (float)(int)approximatedRenderTimeNoConstant) /
       1000.0) / 1000.0;
  local_1dc = calculateSampleFitLinearity<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
                        (samples);
  local_1e0 = calculateSampleTemporalStability<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
                        (samples);
  section.m_log._0_4_ = (float)(int)approximatedRenderTimeNoConstant / sampleTemporalStability;
  section.m_log._4_4_ = (float)(int)approximatedRenderTimeNoConstant / sampleLinearity;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,"ResultLinearity",&local_269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,"Sample linearity",&local_291);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"%",&local_2b9);
  tcu::LogNumber<float>::LogNumber
            (&local_248,&local_268,&local_290,&local_2b8,QP_KEY_TAG_QUALITY,local_1dc * 100.0);
  pTVar4 = tcu::TestLog::operator<<(log,&local_248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"SampleTemporalStability",&local_349);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_370,"Sample temporal stability",&local_371);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"%",&local_399);
  tcu::LogNumber<float>::LogNumber
            (&local_328,&local_348,&local_370,&local_398,QP_KEY_TAG_QUALITY,local_1e0 * 100.0);
  pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_328);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_428,"ApproximatedConstantCost",&local_429);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_450,"Approximated contant cost",&local_451);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_478,"us",&local_479);
  tcu::LogNumber<float>::LogNumber
            (&local_408,&local_428,&local_450,&local_478,QP_KEY_TAG_TIME,
             resultStats.max9DecileRelDiffTime);
  pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_408);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_508,"ApproximatedConstantCostConfidence60Lower",&local_509);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_530,"Approximated contant cost 60% confidence lower limit",&local_531)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_558,"us",&local_559);
  tcu::LogNumber<float>::LogNumber
            (&local_4e8,&local_508,&local_530,&local_558,QP_KEY_TAG_TIME,theilSenFitting.offset);
  pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5e8,"ApproximatedConstantCostConfidence60Upper",&local_5e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_610,"Approximated contant cost 60% confidence upper limit",&local_611)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_638,"us",&local_639);
  tcu::LogNumber<float>::LogNumber
            (&local_5c8,&local_5e8,&local_610,&local_638,QP_KEY_TAG_TIME,
             resultStats.medianRelDiffTime);
  pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_5c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6c8,"ApproximatedLinearCost",&local_6c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6f0,"Approximated linear cost",&local_6f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_718,"us / MB",&local_719);
  tcu::LogNumber<float>::LogNumber
            (&local_6a8,&local_6c8,&local_6f0,&local_718,QP_KEY_TAG_TIME,
             theilSenFitting.offsetConfidenceUpper * 1024.0 * 1024.0);
  pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_6a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7a8,"ApproximatedLinearCostConfidence60Lower",&local_7a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7d0,"Approximated linear cost 60% confidence lower limit",&local_7d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7f8,"us / MB",&local_7f9);
  tcu::LogNumber<float>::LogNumber
            (&local_788,&local_7a8,&local_7d0,&local_7f8,QP_KEY_TAG_TIME,
             theilSenFitting.coefficient * 1024.0 * 1024.0);
  pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_788);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_888,"ApproximatedLinearCostConfidence60Upper",&local_889);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8b0,"Approximated linear cost 60% confidence upper limit",&local_8b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8d8,"us / MB",&local_8d9);
  tcu::LogNumber<float>::LogNumber
            (&local_868,&local_888,&local_8b0,&local_8d8,QP_KEY_TAG_TIME,
             theilSenFitting.offsetConfidenceLower * 1024.0 * 1024.0);
  pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_868);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_968,"ApproximatedProcessRate",&local_969);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_990,"Approximated processing rate",&local_991);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9b8,"MB / s",&local_9b9);
  tcu::LogNumber<float>::LogNumber
            (&local_948,&local_968,&local_990,&local_9b8,QP_KEY_TAG_PERFORMANCE,
             section.m_log._4_4_ * 0.0009765625 * 0.0009765625);
  pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_948);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a48,"ApproximatedProcessRateNoConstant",&local_a49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a70,"Approximated processing rate without constant cost",&local_a71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a98,"MB / s",&local_a99);
  tcu::LogNumber<float>::LogNumber
            (&local_a28,&local_a48,&local_a70,&local_a98,QP_KEY_TAG_PERFORMANCE,
             section.m_log._0_4_ * 0.0009765625 * 0.0009765625);
  pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_a28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b28,"SampleMedianTime",&local_b29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b50,"Median sample time",&local_b51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b78,"us",&local_b79);
  tcu::LogNumber<float>::LogNumber
            (&local_b08,&local_b28,&local_b50,&local_b78,QP_KEY_TAG_TIME,resultStats.result.minTime)
  ;
  pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_b08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c08,"SampleMedianProcess",&local_c09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c30,"Median processing rate",&local_c31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c58,"MB / s",&local_c59);
  tcu::LogNumber<float>::LogNumber
            (&local_be8,&local_c08,&local_c30,&local_c58,QP_KEY_TAG_PERFORMANCE,
             resultStats.total.min2DecileTime * 0.0009765625 * 0.0009765625);
  tcu::TestLog::operator<<(pTVar4,&local_be8);
  tcu::LogNumber<float>::~LogNumber(&local_be8);
  std::__cxx11::string::~string((string *)&local_c58);
  std::allocator<char>::~allocator(&local_c59);
  std::__cxx11::string::~string((string *)&local_c30);
  std::allocator<char>::~allocator(&local_c31);
  std::__cxx11::string::~string((string *)&local_c08);
  std::allocator<char>::~allocator(&local_c09);
  tcu::LogNumber<float>::~LogNumber(&local_b08);
  std::__cxx11::string::~string((string *)&local_b78);
  std::allocator<char>::~allocator(&local_b79);
  std::__cxx11::string::~string((string *)&local_b50);
  std::allocator<char>::~allocator(&local_b51);
  std::__cxx11::string::~string((string *)&local_b28);
  std::allocator<char>::~allocator(&local_b29);
  tcu::LogNumber<float>::~LogNumber(&local_a28);
  std::__cxx11::string::~string((string *)&local_a98);
  std::allocator<char>::~allocator(&local_a99);
  std::__cxx11::string::~string((string *)&local_a70);
  std::allocator<char>::~allocator(&local_a71);
  std::__cxx11::string::~string((string *)&local_a48);
  std::allocator<char>::~allocator(&local_a49);
  tcu::LogNumber<float>::~LogNumber(&local_948);
  std::__cxx11::string::~string((string *)&local_9b8);
  std::allocator<char>::~allocator(&local_9b9);
  std::__cxx11::string::~string((string *)&local_990);
  std::allocator<char>::~allocator(&local_991);
  std::__cxx11::string::~string((string *)&local_968);
  std::allocator<char>::~allocator(&local_969);
  tcu::LogNumber<float>::~LogNumber(&local_868);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::allocator<char>::~allocator(&local_8d9);
  std::__cxx11::string::~string((string *)&local_8b0);
  std::allocator<char>::~allocator(&local_8b1);
  std::__cxx11::string::~string((string *)&local_888);
  std::allocator<char>::~allocator(&local_889);
  tcu::LogNumber<float>::~LogNumber(&local_788);
  std::__cxx11::string::~string((string *)&local_7f8);
  std::allocator<char>::~allocator(&local_7f9);
  std::__cxx11::string::~string((string *)&local_7d0);
  std::allocator<char>::~allocator(&local_7d1);
  std::__cxx11::string::~string((string *)&local_7a8);
  std::allocator<char>::~allocator(&local_7a9);
  tcu::LogNumber<float>::~LogNumber(&local_6a8);
  std::__cxx11::string::~string((string *)&local_718);
  std::allocator<char>::~allocator(&local_719);
  std::__cxx11::string::~string((string *)&local_6f0);
  std::allocator<char>::~allocator(&local_6f1);
  std::__cxx11::string::~string((string *)&local_6c8);
  std::allocator<char>::~allocator(&local_6c9);
  tcu::LogNumber<float>::~LogNumber(&local_5c8);
  std::__cxx11::string::~string((string *)&local_638);
  std::allocator<char>::~allocator(&local_639);
  std::__cxx11::string::~string((string *)&local_610);
  std::allocator<char>::~allocator(&local_611);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::allocator<char>::~allocator(&local_5e9);
  tcu::LogNumber<float>::~LogNumber(&local_4e8);
  std::__cxx11::string::~string((string *)&local_558);
  std::allocator<char>::~allocator(&local_559);
  std::__cxx11::string::~string((string *)&local_530);
  std::allocator<char>::~allocator(&local_531);
  std::__cxx11::string::~string((string *)&local_508);
  std::allocator<char>::~allocator(&local_509);
  tcu::LogNumber<float>::~LogNumber(&local_408);
  std::__cxx11::string::~string((string *)&local_478);
  std::allocator<char>::~allocator(&local_479);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator(&local_451);
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator(&local_429);
  tcu::LogNumber<float>::~LogNumber(&local_328);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator(&local_399);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator(&local_371);
  std::__cxx11::string::~string((string *)&local_348);
  std::allocator<char>::~allocator(&local_349);
  tcu::LogNumber<float>::~LogNumber(&local_248);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator(&local_291);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator(&local_269);
  tcu::ScopedLogSection::~ScopedLogSection(&local_180);
  RVar2.renderRateAtRange = section.m_log._4_4_;
  RVar2.renderRateMedian = resultStats.total.min2DecileTime;
  RVar2.renderRateAtInfinity = section.m_log._0_4_;
  return RVar2;
}

Assistant:

static RenderSampleAnalyzeResult analyzeSampleResults (tcu::TestLog& log, const std::vector<RenderSampleResult<SampleType> >& samples)
{
	// Assume data is linear with some outliers, fit a line
	const LineParametersWithConfidence						theilSenFitting						= fitLineToSamples(samples);
	const typename SampleTypeTraits<SampleType>::StatsType	resultStats							= calculateSampleStatistics(theilSenFitting, samples);
	float													approximatedProcessingRate;
	float													approximatedProcessingRateNoConstant;

	// output raw samples
	{
		const tcu::ScopedLogSection	section(log, "Samples", "Samples");
		logSampleList(log, theilSenFitting, samples);
	}

	// Contributions
	if (SampleTypeTraits<SampleType>::LOG_CONTRIBUTIONS)
	{
		const tcu::ScopedLogSection	section(log, "Contribution", "Contributions");

		logFirstRenderContribution(log, samples, resultStats);
		logUploadContribution(log, samples, resultStats);
		logRenderContribution(log, samples, resultStats);
		logSecondRenderContribution(log, samples, resultStats);
		logReadContribution(log, samples, resultStats);
		logTotalContribution(log, samples, resultStats);
	}

	// print results
	{
		const tcu::ScopedLogSection	section(log, "Results", "Results");

		const int	medianDataSize						= (samples.front().renderDataSize + samples.back().renderDataSize) / 2;
		const float	approximatedRenderTime				= (theilSenFitting.offset + theilSenFitting.coefficient * (float)medianDataSize) / 1000.0f / 1000.0f;
		const float	approximatedRenderTimeNoConstant	= (theilSenFitting.coefficient * (float)medianDataSize) / 1000.0f / 1000.0f;
		const float	sampleLinearity						= calculateSampleFitLinearity(samples);
		const float	sampleTemporalStability				= calculateSampleTemporalStability(samples);

		approximatedProcessingRateNoConstant			= (float)medianDataSize / approximatedRenderTimeNoConstant;
		approximatedProcessingRate						= (float)medianDataSize / approximatedRenderTime;

		log	<< tcu::TestLog::Float("ResultLinearity", "Sample linearity", "%", QP_KEY_TAG_QUALITY, sampleLinearity * 100.0f)
			<< tcu::TestLog::Float("SampleTemporalStability", "Sample temporal stability", "%", QP_KEY_TAG_QUALITY, sampleTemporalStability * 100.0f)
			<< tcu::TestLog::Float("ApproximatedConstantCost", "Approximated contant cost", "us", QP_KEY_TAG_TIME, theilSenFitting.offset)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Lower", "Approximated contant cost 60% confidence lower limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceLower)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Upper", "Approximated contant cost 60% confidence upper limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceUpper)
			<< tcu::TestLog::Float("ApproximatedLinearCost", "Approximated linear cost", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficient * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Lower", "Approximated linear cost 60% confidence lower limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceLower * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Upper", "Approximated linear cost 60% confidence upper limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceUpper * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedProcessRate", "Approximated processing rate", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedProcessingRate / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("ApproximatedProcessRateNoConstant", "Approximated processing rate without constant cost", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedProcessingRateNoConstant / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("SampleMedianTime", "Median sample time", "us", QP_KEY_TAG_TIME, resultStats.result.medianTime)
			<< tcu::TestLog::Float("SampleMedianProcess", "Median processing rate", "MB / s", QP_KEY_TAG_PERFORMANCE, resultStats.medianRate / 1024.0f / 1024.0f);
	}

	// return approximated render rate
	{
		RenderSampleAnalyzeResult result;

		result.renderRateMedian		= resultStats.medianRate;
		result.renderRateAtRange	= approximatedProcessingRate;
		result.renderRateAtInfinity = approximatedProcessingRateNoConstant;

		return result;
	}
	return RenderSampleAnalyzeResult();
}